

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::GeometryShaderTests::init(GeometryShaderTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  TestNodeType TVar4;
  int iVar5;
  deUint32 primitive;
  Context *pCVar6;
  pointer pcVar7;
  char *pcVar8;
  GeometryShaderTests *pGVar9;
  pointer name_00;
  int legalNdx;
  GeometryShaderInputType GVar10;
  int extraout_EAX;
  TestNode *pTVar11;
  TestNode *pTVar12;
  TestNode *pTVar13;
  TestNode *node;
  GeometryProgramLimitCase *pGVar14;
  OutputCountCase *pOVar15;
  long *plVar16;
  undefined8 *puVar17;
  LayeredRenderCase *pLVar18;
  bool bVar19;
  bool bVar20;
  ulong *puVar21;
  size_type *psVar22;
  long *plVar23;
  GeometryShaderInputType inputType;
  GeometryShaderInputType inputType_00;
  long lVar24;
  ulong uVar25;
  undefined8 uVar26;
  uint uVar27;
  char *__end;
  long lVar28;
  string name;
  string desc;
  ostringstream s;
  int in_stack_fffffffffffffcc8;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  GeometryShaderTests *local_2d0;
  string local_2c8;
  string local_2a8;
  string local_288;
  TestNode *local_268;
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  TestNode *local_240;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  TestNode *local_218;
  TestNode *local_210;
  allocator<char> local_201;
  TestNode *local_200;
  TestNode *local_1f8;
  OutputCountPatternSpec local_1f0;
  long lStack_1d8;
  ios_base local_180 [264];
  TestNode *local_78;
  TestNode *local_70;
  TestNode *local_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"query",
             "Query tests.");
  local_268 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_268,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic tests.");
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"input",
             "Different input primitives.");
  local_200 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_200,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"conversion",
             "Different input and output primitives.");
  local_70 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"emit",
             "Different emit counts.");
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_78,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"varying",
             "Test varyings.");
  local_240 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_240,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"layered",
             "Layered rendering.");
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"instanced",
             "Instanced rendering.");
  local_68 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_68,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Negative tests.");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "vertex_transform_feedback","Transform feedback.");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  tcu::TestNode::addChild((TestNode *)this,local_268);
  local_38 = pTVar12;
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  tcu::TestNode::addChild((TestNode *)this,local_200);
  tcu::TestNode::addChild((TestNode *)this,local_70);
  tcu::TestNode::addChild((TestNode *)this,local_78);
  tcu::TestNode::addChild((TestNode *)this,local_240);
  local_218 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  tcu::TestNode::addChild((TestNode *)this,local_68);
  tcu::TestNode::addChild((TestNode *)this,node);
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (this->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_2d0 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryInputComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_input_components",(char *)0x9123,(GLenum)&local_1f0,
             (string *)0x40,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryOutputComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_output_components",(char *)0x9124,(GLenum)&local_1f0,
             (string *)0x40,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryImageUniforms","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_image_uniforms",(char *)0x90cd,(GLenum)&local_1f0,
             (string *)0x0,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryTextureImageUnits","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_texture_image_units",(char *)0x8c29,(GLenum)&local_1f0,
             (string *)0x10,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryOutputVertices","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_output_vertices",(char *)0x8de0,(GLenum)&local_1f0,
             (string *)0x100,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryTotalOutputComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_total_output_components",(char *)0x8de1,(GLenum)&local_1f0
             ,(string *)0x400,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryUniformComponents","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_uniform_components",(char *)0x8ddf,(GLenum)&local_1f0,
             (string *)0x400,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryAtomicCounters","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_atomic_counters",(char *)0x92d5,(GLenum)&local_1f0,
             (string *)0x0,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pGVar14 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"MaxGeometryAtomicCounterBuffers","");
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar14,pCVar6,"max_geometry_atomic_counter_buffers",(char *)0x92cf,(GLenum)&local_1f0,
             (string *)0x0,in_stack_fffffffffffffcc8);
  tcu::TestNode::addChild(pTVar11,(TestNode *)pGVar14);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"geometry_linked_vertices_out",
             "GL_GEOMETRY_LINKED_VERTICES_OUT");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x8916;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_00b45cd8;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,1);
  pcVar7 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar7 = "max_vertices = 1";
  *(char **)(pcVar7 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 1) out;\n"
  ;
  pcVar7[0x10] = '\x01';
  pcVar7[0x11] = '\0';
  pcVar7[0x12] = '\0';
  pcVar7[0x13] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"geometry_linked_input_type",
             "GL_GEOMETRY_LINKED_INPUT_TYPE");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x8917;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_00b45d78;
  local_40 = node;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,3);
  pcVar7 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar7 = "Triangles";
  *(char **)(pcVar7 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar7[0x10] = '\x04';
  pcVar7[0x11] = '\0';
  pcVar7[0x12] = '\0';
  pcVar7[0x13] = '\0';
  *(char **)(pcVar7 + 0x18) = "Lines";
  *(char **)(pcVar7 + 0x20) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (lines) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar7[0x28] = '\x01';
  pcVar7[0x29] = '\0';
  pcVar7[0x2a] = '\0';
  pcVar7[0x2b] = '\0';
  *(char **)(pcVar7 + 0x30) = "Points";
  *(char **)(pcVar7 + 0x38) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (points) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar7[0x40] = '\0';
  pcVar7[0x41] = '\0';
  pcVar7[0x42] = '\0';
  pcVar7[0x43] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"geometry_linked_output_type",
             "GL_GEOMETRY_LINKED_OUTPUT_TYPE");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x8918;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_00b45dc8;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,3);
  pcVar7 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar7 = "Triangle strip";
  *(char **)(pcVar7 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (triangle_strip, max_vertices = 3) out;\n"
  ;
  pcVar7[0x10] = '\x05';
  pcVar7[0x11] = '\0';
  pcVar7[0x12] = '\0';
  pcVar7[0x13] = '\0';
  *(char **)(pcVar7 + 0x18) = "Lines";
  *(char **)(pcVar7 + 0x20) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (line_strip, max_vertices = 3) out;\n"
  ;
  pcVar7[0x28] = '\x03';
  pcVar7[0x29] = '\0';
  pcVar7[0x2a] = '\0';
  pcVar7[0x2b] = '\0';
  *(char **)(pcVar7 + 0x30) = "Points";
  *(char **)(pcVar7 + 0x38) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar7[0x40] = '\0';
  pcVar7[0x41] = '\0';
  pcVar7[0x42] = '\0';
  pcVar7[0x43] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x98);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"geometry_shader_invocations",
             "GL_GEOMETRY_SHADER_INVOCATIONS");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0x887f;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar12[1].m_name._M_string_length = 0;
  pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryProgramQueryCase_00b45e18;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize((vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
            *)&pTVar12[1].m_name,2);
  pcVar7 = pTVar12[1].m_name._M_dataplus._M_p;
  *(char **)pcVar7 = "Default value";
  *(char **)(pcVar7 + 8) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar7[0x10] = '\x01';
  pcVar7[0x11] = '\0';
  pcVar7[0x12] = '\0';
  pcVar7[0x13] = '\0';
  *(char **)(pcVar7 + 0x18) = "Value declared";
  *(char **)(pcVar7 + 0x20) =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles, invocations=2) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pcVar7[0x28] = '\x02';
  pcVar7[0x29] = '\0';
  pcVar7[0x2a] = '\0';
  pcVar7[0x2b] = '\0';
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pGVar9 = local_2d0;
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"max_geometry_shader_invocations",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45e68;
  pTVar12[1].m_testCtx = (TestContext *)0x2000008e5a;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"max_geometry_uniform_blocks",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45e68;
  pTVar12[1].m_testCtx = (TestContext *)0xc00008a2c;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"max_geometry_shader_storage_blocks",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45e68;
  pTVar12[1].m_testCtx = (TestContext *)0x90d7;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"layer_provoking_vertex",
             "GL_LAYER_PROVOKING_VERTEX");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45eb8;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"primitives_generated_no_geometry",
             "PRIMITIVES_GENERATED query with no geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_00b45f08;
  *(undefined4 *)&pTVar12[1].m_testCtx = 0;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"primitives_generated_no_amplification",
             "PRIMITIVES_GENERATED query with non amplifying geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_00b45f08;
  *(undefined4 *)&pTVar12[1].m_testCtx = 1;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"primitives_generated_amplification",
             "PRIMITIVES_GENERATED query with amplifying geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_00b45f08;
  *(undefined4 *)&pTVar12[1].m_testCtx = 2;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"primitives_generated_partial_primitives",
             "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_00b45f08;
  *(undefined4 *)&pTVar12[1].m_testCtx = 3;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x88);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"primitives_generated_instanced",
             "PRIMITIVES_GENERATED query with instanced geometry shader");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__PrimitivesGeneratedQueryCase_00b45f08;
  *(undefined4 *)&pTVar12[1].m_testCtx = 4;
  pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"primitives_generated",
             "Query bound PRIMITIVES_GENERATED query");
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45f58;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x80);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"max_framebuffer_layers",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45e68;
  pTVar12[1].m_testCtx = (TestContext *)0x10000009317;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"framebuffer_default_layers",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b45fa8;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"framebuffer_attachment_layered",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b46010;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"framebuffer_incomplete_layer_targets",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b460f0;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar12 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar12,pCVar6->m_testCtx,"referenced_by_geometry_shader",
             SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b46140;
  tcu::TestNode::addChild(pTVar11,pTVar12);
  pTVar13 = (TestNode *)operator_new(0x78);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,pCVar6->m_testCtx,"max_combined_geometry_uniform_components",
             "MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS");
  pTVar12 = local_268;
  pTVar13[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b46190;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_10","Output 10 vertices",&local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_128","Output 128 vertices",&local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,0x100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_256","Output 256 vertices",&local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,-1);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_max","Output max vertices",&local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,10,100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_10_and_100","Output 10 and 100 vertices in two invocations",
             &local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,100,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_100_and_10","Output 100 and 10 vertices in two invocations",
             &local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,0,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_0_and_128","Output 0 and 128 vertices in two invocations",
             &local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec(&local_1f0,0x80,0);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar6,"output_128_and_0","Output 128 and 0 vertices in two invocations",
             &local_1f0);
  tcu::TestNode::addChild(pTVar12,(TestNode *)pOVar15);
  if ((pointer *)
      local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pTVar11 = (TestNode *)operator_new(0x130);
  pGVar9 = local_2d0;
  pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar6->m_testCtx,"output_vary_by_attribute",
             "Output varying number of vertices");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_emitCount";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46340;
  *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
  pTVar11[2].m_description._M_string_length = 0;
  pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x130);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar6->m_testCtx,"output_vary_by_uniform",
             "Output varying number of vertices");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46340;
  pTVar11[2].m_description._M_string_length = 0;
  pTVar11[2].m_description.field_2._M_allocated_capacity = 1;
  *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x130);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar6->m_testCtx,"output_vary_by_texture",
             "Output varying number of vertices");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46340;
  pTVar11[2].m_description._M_string_length = 0;
  pTVar11[2].m_description.field_2._M_allocated_capacity = 2;
  *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar6->m_testCtx,"point_size","test gl_PointSize");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_pointSize";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46430;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 0;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar6->m_testCtx,"primitive_id_in","test gl_PrimitiveIDIn");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = 0x98644f;
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46430;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 1;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar6->m_testCtx,"primitive_id_in_restarted",
             "test gl_PrimitiveIDIn with primitive restart");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = 0x98644f;
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000006;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46430;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 1;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x128);
  pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar6->m_testCtx,"primitive_id","test gl_PrimitiveID");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
  pTVar11[1].m_testCtx = (TestContext *)0x0;
  pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)&pTVar11[1].m_name._M_string_length = 0;
  pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_primitiveID";
  *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
  *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
  *(undefined8 *)&pTVar11[1].field_0x54 = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&pTVar11[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46430;
  pTVar11[2].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar11[2].m_description.field_2 = 2;
  tcu::TestNode::addChild(pTVar12,pTVar11);
  local_210 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_210,
             (pGVar9->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_primitive","Different input and output primitives.");
  local_1f8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f8,
             (pGVar9->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "triangle_strip_adjacency","Different triangle_strip_adjacency vertex counts.");
  lVar24 = 0x10;
  do {
    pTVar11 = (TestNode *)operator_new(0x120);
    pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
    pcVar8 = *(char **)((long)&init::layerTargets[3].desc + lVar24);
    uVar1 = *(undefined4 *)((long)&init::layerTargets[3].name + lVar24);
    uVar2 = *(undefined4 *)((long)&init::inputPrimitives[0].primitiveType + lVar24);
    tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar6->m_testCtx,pcVar8,pcVar8);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46268;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
    *(undefined4 *)((long)&pTVar11[1].m_name._M_dataplus._M_p + 4) = uVar1;
    *(undefined4 *)&pTVar11[1].m_name._M_string_length = uVar2;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46520;
    pTVar11[2].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_210,pTVar11);
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x100);
  pTVar11 = (TestNode *)0x0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    local_268 = pTVar11;
    std::ostream::operator<<((ostringstream *)&local_1f0,(int)pTVar11);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x963fc3);
    local_330 = &local_320;
    puVar21 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar21) {
      local_320 = *puVar21;
      lStack_318 = plVar16[3];
    }
    else {
      local_320 = *puVar21;
      local_330 = (ulong *)*plVar16;
    }
    local_328 = plVar16[1];
    *plVar16 = (long)puVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    std::ostream::operator<<((ostringstream *)&local_1f0,(int)local_268);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,0x963fd1);
    local_2f0 = &local_2e0;
    puVar21 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar21) {
      local_2e0 = *puVar21;
      lStack_2d8 = plVar16[3];
    }
    else {
      local_2e0 = *puVar21;
      local_2f0 = (ulong *)*plVar16;
    }
    local_2e8 = plVar16[1];
    *plVar16 = (long)puVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    pTVar11 = (TestNode *)operator_new(0x128);
    pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar6->m_testCtx,(char *)local_330,(char *)local_2f0);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    pTVar11[1].m_name._M_dataplus._M_p = (pointer)0xd00000000;
    *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11[2].m_description._M_string_length = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46610;
    *(int *)&pTVar11[2].m_description.field_2 = (int)local_268;
    tcu::TestNode::addChild(local_1f8,pTVar11);
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    pTVar12 = local_38;
    uVar27 = (int)local_268 + 1;
    pTVar11 = (TestNode *)(ulong)uVar27;
  } while (uVar27 != 0xd);
  tcu::TestNode::addChild(local_38,local_210);
  tcu::TestNode::addChild(pTVar12,local_1f8);
  lVar24 = 0x10;
  do {
    pTVar11 = (TestNode *)operator_new(0x120);
    pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
    pcVar8 = *(char **)((long)&init::inputPrimitives[9].outputType + lVar24);
    uVar1 = *(undefined4 *)((long)&init::inputPrimitives[9].name + lVar24);
    uVar2 = *(undefined4 *)((long)&init::conversionPrimitives[0].primitiveType + lVar24);
    tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar6->m_testCtx,pcVar8,pcVar8);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46268;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
    *(undefined4 *)((long)&pTVar11[1].m_name._M_dataplus._M_p + 4) = uVar1;
    *(undefined4 *)&pTVar11[1].m_name._M_string_length = uVar2;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46520;
    pTVar11[2].m_description._M_string_length = 0;
    tcu::TestNode::addChild(local_200,pTVar11);
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0xa0);
  lVar24 = 0x18;
  do {
    pcVar8 = *(char **)((long)&init::emitTests[0].outputType + lVar24);
    local_268 = (TestNode *)lVar24;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,pcVar8,(allocator<char> *)&local_238);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    puVar21 = (ulong *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar21) {
      local_2c8.field_2._M_allocated_capacity = *puVar21;
      local_2c8.field_2._8_8_ = plVar16[3];
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *puVar21;
      local_2c8._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_2c8._M_string_length = plVar16[1];
    *plVar16 = (long)puVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    local_1f8 = (TestNode *)
                CONCAT44(local_1f8._4_4_,
                         *(int *)(&init::conversionPrimitives[5].field_0x4 + (long)local_268));
    std::ostream::operator<<
              ((ostringstream *)&local_1f0,
               *(int *)(&init::conversionPrimitives[5].field_0x4 + (long)local_268));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      uVar26 = local_2c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_288._M_string_length + local_2c8._M_string_length) {
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        uVar26 = local_288.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_288._M_string_length + local_2c8._M_string_length)
      goto LAB_00396a45;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_288,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
    }
    else {
LAB_00396a45:
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2c8,(ulong)local_288._M_dataplus._M_p);
    }
    local_310 = &local_300;
    puVar21 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar21) {
      local_300 = *puVar21;
      lStack_2f8 = puVar17[3];
    }
    else {
      local_300 = *puVar21;
      local_310 = (ulong *)*puVar17;
    }
    local_308 = puVar17[1];
    *puVar17 = puVar21;
    puVar17[1] = 0;
    *(undefined1 *)puVar21 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_310);
    puVar21 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar21) {
      local_2e0 = *puVar21;
      lStack_2d8 = plVar16[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0 = *puVar21;
      local_2f0 = (ulong *)*plVar16;
    }
    local_2e8 = plVar16[1];
    *plVar16 = (long)puVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    iVar3 = *(int *)((long)&init::conversionPrimitives[5].name + (long)local_268);
    local_200 = (TestNode *)CONCAT44(local_200._4_4_,iVar3);
    std::ostream::operator<<((ostringstream *)&local_1f0,iVar3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    uVar25 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar25 = local_2e0;
    }
    if (uVar25 < (ulong)(local_258 + local_2e8)) {
      uVar25 = 0xf;
      if (local_260 != local_250) {
        uVar25 = local_250[0];
      }
      if (uVar25 < (ulong)(local_258 + local_2e8)) goto LAB_00396bb5;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_2f0);
    }
    else {
LAB_00396bb5:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_260);
    }
    local_330 = &local_320;
    puVar21 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar21) {
      local_320 = *puVar21;
      lStack_318 = puVar17[3];
    }
    else {
      local_320 = *puVar21;
      local_330 = (ulong *)*puVar17;
    }
    local_328 = puVar17[1];
    *puVar17 = puVar21;
    puVar17[1] = 0;
    *(undefined1 *)puVar21 = 0;
    if (local_260 != local_250) {
      operator_delete(local_260,local_250[0] + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar8,&local_201);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_260);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    puVar21 = (ulong *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar21) {
      local_288.field_2._M_allocated_capacity = *puVar21;
      local_288.field_2._8_8_ = plVar16[3];
    }
    else {
      local_288.field_2._M_allocated_capacity = *puVar21;
      local_288._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_288._M_string_length = plVar16[1];
    *plVar16 = (long)puVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    std::ostream::operator<<((ostringstream *)&local_1f0,(int)local_1f8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      uVar26 = local_288.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_230 + local_288._M_string_length) {
      uVar25 = 0xf;
      if (local_238 != local_228) {
        uVar25 = local_228[0];
      }
      if (uVar25 < local_230 + local_288._M_string_length) goto LAB_00396e19;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_238,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
    }
    else {
LAB_00396e19:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_238);
    }
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    puVar21 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar21) {
      local_2a8.field_2._M_allocated_capacity = *puVar21;
      local_2a8.field_2._8_8_ = puVar17[3];
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *puVar21;
      local_2a8._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_2a8._M_string_length = puVar17[1];
    *puVar17 = puVar21;
    puVar17[1] = 0;
    *(undefined1 *)puVar21 = 0;
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    puVar21 = puVar17 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar21) {
      local_2c8.field_2._M_allocated_capacity = *puVar21;
      local_2c8.field_2._8_8_ = puVar17[3];
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *puVar21;
      local_2c8._M_dataplus._M_p = (pointer)*puVar17;
    }
    local_2c8._M_string_length = puVar17[1];
    *puVar17 = puVar21;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    std::ostream::operator<<((ostringstream *)&local_1f0,(int)local_200);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      uVar26 = local_2c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_58 + local_2c8._M_string_length) {
      uVar25 = 0xf;
      if (local_60 != local_50) {
        uVar25 = local_50[0];
      }
      if (uVar25 < local_58 + local_2c8._M_string_length) goto LAB_00396fa1;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_60,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
    }
    else {
LAB_00396fa1:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_60);
    }
    local_310 = &local_300;
    puVar21 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar21) {
      local_300 = *puVar21;
      lStack_2f8 = puVar17[3];
    }
    else {
      local_300 = *puVar21;
      local_310 = (ulong *)*puVar17;
    }
    local_308 = puVar17[1];
    *puVar17 = puVar21;
    puVar17[1] = 0;
    *(undefined1 *)puVar21 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_310);
    puVar21 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar21) {
      local_2e0 = *puVar21;
      lStack_2d8 = plVar16[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0 = *puVar21;
      local_2f0 = (ulong *)*plVar16;
    }
    local_2e8 = plVar16[1];
    *plVar16 = (long)puVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != local_250) {
      operator_delete(local_260,local_250[0] + 1);
    }
    iVar3 = *(int *)((long)&init::conversionPrimitives[5].name + (long)local_268 + 4);
    local_210 = (TestNode *)CONCAT44(local_210._4_4_,iVar3);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::ostream::operator<<((ostringstream *)&local_1f0,(int)local_210);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,0x964050);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      psVar22 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_2a8.field_2._M_allocated_capacity = *psVar22;
        local_2a8.field_2._8_8_ = plVar16[3];
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar22;
        local_2a8._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_2a8._M_string_length = plVar16[1];
      *plVar16 = (long)psVar22;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      puVar21 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_2c8.field_2._M_allocated_capacity = *puVar21;
        local_2c8.field_2._8_8_ = plVar16[3];
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *puVar21;
        local_2c8._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_2c8._M_string_length = plVar16[1];
      *plVar16 = (long)puVar21;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      iVar3 = *(int *)((long)&init::conversionPrimitives[5].outputType + (long)local_268);
      std::ostream::operator<<((ostringstream *)&local_1f0,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        uVar26 = local_2c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_258 + local_2c8._M_string_length) {
        uVar25 = 0xf;
        if (local_260 != local_250) {
          uVar25 = local_250[0];
        }
        if (uVar25 < local_258 + local_2c8._M_string_length) goto LAB_0039734c;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_260,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
      }
      else {
LAB_0039734c:
        puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_260)
        ;
      }
      local_310 = &local_300;
      puVar21 = puVar17 + 2;
      if ((ulong *)*puVar17 == puVar21) {
        local_300 = *puVar21;
        lStack_2f8 = puVar17[3];
      }
      else {
        local_300 = *puVar21;
        local_310 = (ulong *)*puVar17;
      }
      local_308 = puVar17[1];
      *puVar17 = puVar21;
      puVar17[1] = 0;
      *(undefined1 *)puVar21 = 0;
      std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_310);
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::ostream::operator<<((ostringstream *)&local_1f0,(int)local_210);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,0x964064);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      puVar21 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_288.field_2._M_allocated_capacity = *puVar21;
        local_288.field_2._8_8_ = plVar16[3];
      }
      else {
        local_288.field_2._M_allocated_capacity = *puVar21;
        local_288._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_288._M_string_length = plVar16[1];
      *plVar16 = (long)puVar21;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      puVar21 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_2a8.field_2._M_allocated_capacity = *puVar21;
        local_2a8.field_2._8_8_ = puVar17[3];
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *puVar21;
        local_2a8._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_2a8._M_string_length = puVar17[1];
      *puVar17 = puVar21;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
      std::ostream::operator<<((ostringstream *)&local_1f0,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
      std::ios_base::~ios_base(local_180);
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        uVar26 = local_2a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_230 + local_2a8._M_string_length) {
        uVar25 = 0xf;
        if (local_238 != local_228) {
          uVar25 = local_228[0];
        }
        if (uVar25 < local_230 + local_2a8._M_string_length) goto LAB_00397654;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_238,0,(char *)0x0,(ulong)local_2a8._M_dataplus._M_p);
      }
      else {
LAB_00397654:
        puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_238)
        ;
      }
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      puVar21 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_2c8.field_2._M_allocated_capacity = *puVar21;
        local_2c8.field_2._8_8_ = puVar17[3];
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *puVar21;
        local_2c8._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_2c8._M_string_length = puVar17[1];
      *puVar17 = puVar21;
      puVar17[1] = 0;
      *(undefined1 *)puVar21 = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      local_310 = &local_300;
      puVar21 = puVar17 + 2;
      if ((ulong *)*puVar17 == puVar21) {
        local_300 = *puVar21;
        lStack_2f8 = puVar17[3];
      }
      else {
        local_300 = *puVar21;
        local_310 = (ulong *)*puVar17;
      }
      local_308 = puVar17[1];
      *puVar17 = puVar21;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_310);
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if (local_238 != local_228) {
        operator_delete(local_238,local_228[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
    }
    pTVar11 = (TestNode *)operator_new(0x138);
    pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
    TVar4 = *(TestNodeType *)((long)&init::conversionPrimitives[5].primitiveType + (long)local_268);
    uVar1 = *(undefined4 *)((long)&init::conversionPrimitives[5].outputType + (long)local_268);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,pCVar6->m_testCtx,(char *)local_330,(char *)local_2f0);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
    pTVar11[1].m_testCtx = (TestContext *)0x0;
    pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
    *(TestNodeType *)&pTVar11[1].m_name._M_string_length = TVar4;
    pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
    *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
    *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
    *(undefined8 *)&pTVar11[1].field_0x54 = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&pTVar11[1].m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
    *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
    *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46680;
    pTVar11[2].m_description._M_string_length = 0;
    *(int *)&pTVar11[2].m_description.field_2 = (int)local_1f8;
    *(int *)((long)&pTVar11[2].m_description.field_2 + 4) = (int)local_200;
    *(int *)((long)&pTVar11[2].m_description.field_2 + 8) = (int)local_210;
    *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 0xc) = uVar1;
    pTVar11[2].m_nodeType = TVar4;
    tcu::TestNode::addChild(local_70,pTVar11);
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    lVar24 = (long)local_268 + 0x20;
    if (lVar24 == 0x2f8) {
      lVar24 = 0;
      do {
        pTVar11 = (TestNode *)operator_new(0x128);
        pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
        uVar1 = *(undefined4 *)((long)&init::varyingTests[0].vertexOutputs + lVar24);
        uVar2 = *(undefined4 *)((long)&init::varyingTests[0].geometryOutputs + lVar24);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar11,pCVar6->m_testCtx,
                   *(char **)((long)&init::varyingTests[0].name + lVar24),
                   *(char **)((long)&init::varyingTests[0].desc + lVar24));
        pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
        pTVar11[1].m_testCtx = (TestContext *)0x0;
        pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x400000000;
        *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
        pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
        *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
        *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
        *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
        *(undefined8 *)&pTVar11[1].field_0x54 = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
        *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
        pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46770;
        pTVar11[2].m_description._M_string_length = 0;
        *(undefined4 *)&pTVar11[2].m_description.field_2 = uVar1;
        *(undefined4 *)((long)&pTVar11[2].m_description.field_2 + 4) = uVar2;
        tcu::TestNode::addChild(local_78,pTVar11);
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x78);
      lVar24 = 0;
      do {
        pcVar8 = init::tests[lVar24].testPrefix;
        lVar28 = 0x10;
        local_268 = (TestNode *)lVar24;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,pcVar8,(allocator<char> *)&local_2f0);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_330);
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar23 = plVar16 + 2;
          if ((pointer *)*plVar16 == (pointer *)plVar23) {
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
            lStack_1d8 = plVar16[3];
          }
          else {
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar23;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,init::tests[lVar24].descPrefix,
                     (allocator<char> *)&local_310);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
          local_330 = &local_320;
          puVar21 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar21) {
            local_320 = *puVar21;
            lStack_318 = plVar16[3];
          }
          else {
            local_320 = *puVar21;
            local_330 = (ulong *)*plVar16;
          }
          local_328 = plVar16[1];
          *plVar16 = (long)puVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
          pLVar18 = (LayeredRenderCase *)operator_new(0xc0);
          anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                    (pLVar18,(local_2d0->super_TestCaseGroup).m_context,
                     (char *)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start,(char *)local_330,
                     *(LayeredRenderTargetType *)((long)&PTR_iterate_00b45630 + lVar28),
                     init::tests[lVar24].test);
          tcu::TestNode::addChild(local_240,(TestNode *)pLVar18);
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          if ((pointer *)
              local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          lVar28 = lVar28 + 0x18;
        } while (lVar28 != 0x70);
        lVar24 = (long)local_268 + 1;
      } while (lVar24 != 6);
      lVar24 = 8;
      do {
        pTVar11 = (TestNode *)operator_new(0x128);
        local_240 = (TestNode *)(local_2d0->super_TestCaseGroup).m_context;
        local_2f0 = &local_2e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"geometry_","");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_330 = &local_320;
        puVar21 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar21) {
          local_320 = *puVar21;
          lStack_318 = plVar16[3];
        }
        else {
          local_320 = *puVar21;
          local_330 = (ulong *)*plVar16;
        }
        local_328 = plVar16[1];
        *plVar16 = (long)puVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        plVar23 = plVar16 + 2;
        if ((pointer *)*plVar16 == (pointer *)plVar23) {
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
          lStack_1d8 = plVar16[3];
        }
        else {
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar16;
        }
        name_00 = local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar16[1];
        *plVar16 = (long)plVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,"Geometry shader with ","");
        puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        puVar21 = puVar17 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar21) {
          local_2c8.field_2._M_allocated_capacity = *puVar21;
          local_2c8.field_2._8_8_ = puVar17[3];
        }
        else {
          local_2c8.field_2._M_allocated_capacity = *puVar21;
          local_2c8._M_dataplus._M_p = (pointer)*puVar17;
        }
        local_2c8._M_string_length = puVar17[1];
        *puVar17 = puVar21;
        puVar17[1] = 0;
        *(undefined1 *)(puVar17 + 2) = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        pTVar12 = local_240;
        local_310 = &local_300;
        puVar21 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar21) {
          local_300 = *puVar21;
          lStack_2f8 = plVar16[3];
        }
        else {
          local_300 = *puVar21;
          local_310 = (ulong *)*plVar16;
        }
        local_308 = plVar16[1];
        *plVar16 = (long)puVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        uVar1 = *(undefined4 *)((long)&init::invocationCases[0].name + lVar24);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar11,(TestContext *)local_240->_vptr_TestNode,(char *)name_00,
                   (char *)local_310);
        pTVar11[1]._vptr_TestNode = (_func_int **)pTVar12;
        pTVar11[1].m_testCtx = (TestContext *)0x0;
        pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
        *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
        pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
        *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
        *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
        *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
        *(undefined8 *)&pTVar11[1].field_0x54 = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&pTVar11[1].m_children.
                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
        *(undefined8 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
        pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryInvocationCase_00b468b0;
        *(undefined4 *)((long)&pTVar11[2].m_description._M_string_length + 4) = uVar1;
        pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
        tcu::TestNode::addChild(local_218,pTVar11);
        if (local_310 != &local_300) {
          operator_delete(local_310,local_300 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        lVar24 = lVar24 + 0x10;
      } while (lVar24 != 0x58);
      lVar24 = 8;
      do {
        iVar3 = *(int *)((long)&init::invocationCases[0].name + lVar24);
        if (iVar3 != 1) {
          pTVar11 = (TestNode *)operator_new(0x128);
          pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
          local_2f0 = &local_2e0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f0,"geometry_output_different_","");
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
          local_330 = &local_320;
          puVar21 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar21) {
            local_320 = *puVar21;
            lStack_318 = plVar16[3];
          }
          else {
            local_320 = *puVar21;
            local_330 = (ulong *)*plVar16;
          }
          local_328 = plVar16[1];
          *plVar16 = (long)puVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_330);
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar23 = plVar16 + 2;
          if ((pointer *)*plVar16 == (pointer *)plVar23) {
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
            lStack_1d8 = plVar16[3];
          }
          else {
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar23;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar11,pCVar6->m_testCtx,
                     (char *)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                     "Geometry shader invocation(s) with different emit counts");
          pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar11[1].m_testCtx = (TestContext *)0x0;
          pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
          *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
          pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_color";
          *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000000;
          *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
          *(undefined8 *)&pTVar11[1].field_0x54 = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0x100000000;
          pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryInvocationCase_00b468b0;
          *(int *)((long)&pTVar11[2].m_description._M_string_length + 4) = iVar3;
          pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(local_218,pTVar11);
          if ((pointer *)
              local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
        }
        lVar24 = lVar24 + 0x10;
      } while (lVar24 != 0x58);
      lVar24 = 0x10;
      do {
        local_330 = &local_320;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,"invocation_per_layer_","");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        plVar23 = plVar16 + 2;
        if ((pointer *)*plVar16 == (pointer *)plVar23) {
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
          lStack_1d8 = plVar16[3];
        }
        else {
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar16;
        }
        local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar16[1];
        *plVar16 = (long)plVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        local_2f0 = &local_2e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f0,
                   "Render to multiple layers with multiple invocations, one invocation per layer, target "
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_330 = &local_320;
        puVar21 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar21) {
          local_320 = *puVar21;
          lStack_318 = plVar16[3];
        }
        else {
          local_320 = *puVar21;
          local_330 = (ulong *)*plVar16;
        }
        local_328 = plVar16[1];
        *plVar16 = (long)puVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        pLVar18 = (LayeredRenderCase *)operator_new(0xc0);
        anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                  (pLVar18,(local_2d0->super_TestCaseGroup).m_context,
                   (char *)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,(char *)local_330,
                   *(LayeredRenderTargetType *)((long)&PTR_iterate_00b45630 + lVar24),
                   TEST_INVOCATION_PER_LAYER);
        tcu::TestNode::addChild(local_218,(TestNode *)pLVar18);
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if ((pointer *)
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x70);
      lVar24 = 0x10;
      do {
        local_330 = &local_320;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_330,"multiple_layers_per_invocation_","");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        plVar23 = plVar16 + 2;
        if ((pointer *)*plVar16 == (pointer *)plVar23) {
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
          lStack_1d8 = plVar16[3];
        }
        else {
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar23;
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar16;
        }
        local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar16[1];
        *plVar16 = (long)plVar23;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        local_2f0 = &local_2e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f0,
                   "Render to multiple layers with multiple invocations, multiple layers per invocation, target "
                   ,"");
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_330 = &local_320;
        puVar21 = (ulong *)(plVar16 + 2);
        if ((ulong *)*plVar16 == puVar21) {
          local_320 = *puVar21;
          lStack_318 = plVar16[3];
        }
        else {
          local_320 = *puVar21;
          local_330 = (ulong *)*plVar16;
        }
        local_328 = plVar16[1];
        *plVar16 = (long)puVar21;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        pLVar18 = (LayeredRenderCase *)operator_new(0xc0);
        anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                  (pLVar18,(local_2d0->super_TestCaseGroup).m_context,
                   (char *)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,(char *)local_330,
                   *(LayeredRenderTargetType *)((long)&PTR_iterate_00b45630 + lVar24),
                   TEST_MULTIPLE_LAYERS_PER_INVOCATION);
        tcu::TestNode::addChild(local_218,(TestNode *)pLVar18);
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if ((pointer *)
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        lVar24 = lVar24 + 0x18;
      } while (lVar24 != 0x70);
      pTVar12 = (TestNode *)operator_new(0x130);
      pGVar9 = local_2d0;
      pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,pCVar6->m_testCtx,"invocation_output_vary_by_attribute",
                 "Output varying number of vertices");
      pTVar11 = local_218;
      pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
      pTVar12[1].m_testCtx = (TestContext *)0x0;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
      pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_emitCount";
      *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
      *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
      *(undefined8 *)&pTVar12[1].field_0x54 = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
      *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46340;
      pTVar12[2].m_description._M_string_length = 0;
      pTVar12[2].m_description.field_2._M_allocated_capacity = 0x100000000;
      *(undefined4 *)((long)&pTVar12[2].m_description.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_218,pTVar12);
      pTVar12 = (TestNode *)operator_new(0x130);
      pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,pCVar6->m_testCtx,"invocation_output_vary_by_uniform",
                 "Output varying number of vertices");
      pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
      pTVar12[1].m_testCtx = (TestContext *)0x0;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
      pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
      *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
      *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
      *(undefined8 *)&pTVar12[1].field_0x54 = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
      *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46340;
      pTVar12[2].m_description._M_string_length = 0;
      pTVar12[2].m_description.field_2._M_allocated_capacity = 0x100000001;
      *(undefined4 *)((long)&pTVar12[2].m_description.field_2 + 8) = 0;
      tcu::TestNode::addChild(pTVar11,pTVar12);
      pTVar12 = (TestNode *)operator_new(0x130);
      pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,pCVar6->m_testCtx,"invocation_output_vary_by_texture",
                 "Output varying number of vertices");
      pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
      pTVar12[1].m_testCtx = (TestContext *)0x0;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined4 *)&pTVar12[1].m_name._M_string_length = 5;
      pTVar12[1].m_name.field_2._M_allocated_capacity = (size_type)"a_vertexNdx";
      *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0x10000000000;
      *(undefined4 *)&pTVar12[1].m_description._M_dataplus._M_p = 0x100;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 0xc) = 0;
      *(undefined8 *)&pTVar12[1].field_0x54 = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&pTVar12[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 4) = 0;
      *(undefined8 *)((long)&pTVar12[2].m_name.field_2 + 0xc) = 0;
      *(undefined4 *)((long)&pTVar12[2].m_description._M_dataplus._M_p + 4) = 0;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b46340;
      pTVar12[2].m_description._M_string_length = 0;
      pTVar12[2].m_description.field_2._M_allocated_capacity = 0x100000002;
      local_240 = (TestNode *)0x0;
      *(undefined4 *)((long)&pTVar12[2].m_description.field_2 + 8) = 0;
      tcu::TestNode::addChild(pTVar11,pTVar12);
      do {
        lVar24 = 0;
        do {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"draw_","");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          iVar3 = init::numDrawInstances[(long)local_240];
          std::ostream::operator<<((ostringstream *)&local_1f0,iVar3);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          std::ios_base::~ios_base(local_180);
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            uVar26 = local_2a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_288._M_string_length + local_2a8._M_string_length) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              uVar26 = local_288.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_288._M_string_length + local_2a8._M_string_length)
            goto LAB_003989cd;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_288,0,(char *)0x0,(ulong)local_2a8._M_dataplus._M_p);
          }
          else {
LAB_003989cd:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2a8,(ulong)local_288._M_dataplus._M_p);
          }
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          psVar22 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_2c8.field_2._M_allocated_capacity = *psVar22;
            local_2c8.field_2._8_8_ = puVar17[3];
          }
          else {
            local_2c8.field_2._M_allocated_capacity = *psVar22;
            local_2c8._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_2c8._M_string_length = puVar17[1];
          *puVar17 = psVar22;
          puVar17[1] = 0;
          *(undefined1 *)psVar22 = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2c8);
          local_310 = &local_300;
          puVar21 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar21) {
            local_300 = *puVar21;
            lStack_2f8 = plVar16[3];
          }
          else {
            local_300 = *puVar21;
            local_310 = (ulong *)*plVar16;
          }
          local_308 = plVar16[1];
          *plVar16 = (long)puVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          iVar5 = *(int *)((long)init::numDrawInvocations + lVar24);
          std::ostream::operator<<((ostringstream *)&local_1f0,iVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          std::ios_base::~ios_base(local_180);
          uVar25 = 0xf;
          if (local_310 != &local_300) {
            uVar25 = local_300;
          }
          if (uVar25 < (ulong)(local_258 + local_308)) {
            uVar25 = 0xf;
            if (local_260 != local_250) {
              uVar25 = local_250[0];
            }
            if (uVar25 < (ulong)(local_258 + local_308)) goto LAB_00398b3c;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_310);
          }
          else {
LAB_00398b3c:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_260);
          }
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_2e0 = *puVar21;
            lStack_2d8 = puVar17[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar21;
            local_2f0 = (ulong *)*puVar17;
          }
          local_2e8 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)puVar21 = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
          local_330 = &local_320;
          puVar21 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar21) {
            local_320 = *puVar21;
            lStack_318 = plVar16[3];
          }
          else {
            local_320 = *puVar21;
            local_330 = (ulong *)*plVar16;
          }
          local_328 = plVar16[1];
          *plVar16 = (long)puVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
          if (local_260 != local_250) {
            operator_delete(local_260,local_250[0] + 1);
          }
          if (local_310 != &local_300) {
            operator_delete(local_310,local_300 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Draw ","");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          std::ostream::operator<<((ostringstream *)&local_1f0,iVar3);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          std::ios_base::~ios_base(local_180);
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            uVar26 = local_288.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_258 + local_288._M_string_length) {
            uVar25 = 0xf;
            if (local_260 != local_250) {
              uVar25 = local_250[0];
            }
            if (uVar25 < local_258 + local_288._M_string_length) goto LAB_00398d8d;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_260,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
          }
          else {
LAB_00398d8d:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_260);
          }
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          puVar21 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_2a8.field_2._M_allocated_capacity = *puVar21;
            local_2a8.field_2._8_8_ = puVar17[3];
          }
          else {
            local_2a8.field_2._M_allocated_capacity = *puVar21;
            local_2a8._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_2a8._M_string_length = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)puVar21 = 0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          puVar21 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_2c8.field_2._M_allocated_capacity = *puVar21;
            local_2c8.field_2._8_8_ = puVar17[3];
          }
          else {
            local_2c8.field_2._M_allocated_capacity = *puVar21;
            local_2c8._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_2c8._M_string_length = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
          std::ostream::operator<<((ostringstream *)&local_1f0,iVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
          std::ios_base::~ios_base(local_180);
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            uVar26 = local_2c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_230 + local_2c8._M_string_length) {
            uVar25 = 0xf;
            if (local_238 != local_228) {
              uVar25 = local_228[0];
            }
            if (uVar25 < local_230 + local_2c8._M_string_length) goto LAB_00398f09;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_238,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
          }
          else {
LAB_00398f09:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_238);
          }
          local_310 = &local_300;
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_300 = *puVar21;
            lStack_2f8 = puVar17[3];
          }
          else {
            local_300 = *puVar21;
            local_310 = (ulong *)*puVar17;
          }
          local_308 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)puVar21 = 0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_2e0 = *puVar21;
            lStack_2d8 = puVar17[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar21;
            local_2f0 = (ulong *)*puVar17;
          }
          local_2e8 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          if (local_310 != &local_300) {
            operator_delete(local_310,local_300 + 1);
          }
          if (local_238 != local_228) {
            operator_delete(local_238,local_228[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if (local_260 != local_250) {
            operator_delete(local_260,local_250[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          pTVar11 = (TestNode *)operator_new(0x128);
          pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar11,pCVar6->m_testCtx,(char *)local_330,(char *)local_2f0);
          pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar11[1].m_testCtx = (TestContext *)0x0;
          pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
          *(undefined4 *)&pTVar11[1].m_name._M_string_length = 5;
          pTVar11[1].m_name.field_2._M_allocated_capacity = (size_type)"a_offset";
          *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0x10000000001;
          *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0x100;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 0xc) = 0;
          *(undefined8 *)&pTVar11[1].field_0x54 = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4) = 0;
          *(undefined8 *)
           ((long)&pTVar11[1].m_children.
                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2]._vptr_TestNode + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_testCtx + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 4) = 0;
          *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 0xc) = 0;
          *(undefined4 *)((long)&pTVar11[2].m_description._M_dataplus._M_p + 4) = 0;
          pTVar11->_vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00b469a0;
          *(int *)&pTVar11[2].m_description._M_string_length = iVar3;
          *(int *)((long)&pTVar11[2].m_description._M_string_length + 4) = iVar5;
          pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(local_218,pTVar11);
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          lVar24 = lVar24 + 4;
        } while (lVar24 == 4);
        local_240 = (TestNode *)((long)local_240 + 1);
      } while (local_240 != (TestNode *)0x3);
      lVar24 = 0;
      local_240 = (TestNode *)0x3;
      do {
        primitive = init::inputTypes[lVar24];
        lVar28 = 0;
        local_218 = (TestNode *)lVar24;
        do {
          uVar27 = init::primitiveTypes[lVar28];
          local_310 = &local_300;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"type_","");
          GVar10 = sglr::rr_util::mapGLGeometryShaderInputType(primitive);
          (anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                    (&local_2c8,(_anonymous_namespace_ *)(ulong)GVar10,inputType);
          uVar25 = 0xf;
          if (local_310 != &local_300) {
            uVar25 = local_300;
          }
          if (uVar25 < local_2c8._M_string_length + local_308) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              uVar26 = local_2c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_2c8._M_string_length + local_308) goto LAB_0039929f;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2c8,0,(char *)0x0,(ulong)local_310);
          }
          else {
LAB_0039929f:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_310,(ulong)local_2c8._M_dataplus._M_p);
          }
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_2e0 = *puVar21;
            lStack_2d8 = puVar17[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar21;
            local_2f0 = (ulong *)*puVar17;
          }
          local_2e8 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)puVar21 = 0;
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_2f0);
          local_330 = &local_320;
          puVar21 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar21) {
            local_320 = *puVar21;
            lStack_318 = plVar16[3];
          }
          else {
            local_320 = *puVar21;
            local_330 = (ulong *)*plVar16;
          }
          local_328 = plVar16[1];
          *plVar16 = (long)puVar21;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          (anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                    (&local_2a8,(_anonymous_namespace_ *)(ulong)uVar27,(GLenum)local_328);
          uVar25 = 0xf;
          if (local_330 != &local_320) {
            uVar25 = local_320;
          }
          if (uVar25 < local_2a8._M_string_length + local_328) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              uVar26 = local_2a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_2a8._M_string_length + local_328) goto LAB_003993bc;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2a8,0,(char *)0x0,(ulong)local_330);
          }
          else {
LAB_003993bc:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_330,(ulong)local_2a8._M_dataplus._M_p);
          }
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          plVar16 = puVar17 + 2;
          if ((pointer *)*puVar17 == (pointer *)plVar16) {
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar16;
            lStack_1d8 = puVar17[3];
          }
          else {
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar16;
            local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*puVar17;
          }
          local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puVar17[1];
          *puVar17 = plVar16;
          puVar17[1] = 0;
          *(undefined1 *)plVar16 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if (local_310 != &local_300) {
            operator_delete(local_310,local_300 + 1);
          }
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2c8,"Shader input type ","");
          GVar10 = sglr::rr_util::mapGLGeometryShaderInputType(primitive);
          (anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                    (&local_2a8,(_anonymous_namespace_ *)(ulong)GVar10,inputType_00);
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            uVar26 = local_2c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_2a8._M_string_length + local_2c8._M_string_length) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              uVar26 = local_2a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_2a8._M_string_length + local_2c8._M_string_length)
            goto LAB_00399563;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_2a8,0,(char *)0x0,(ulong)local_2c8._M_dataplus._M_p);
          }
          else {
LAB_00399563:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2c8,(ulong)local_2a8._M_dataplus._M_p);
          }
          local_310 = &local_300;
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_300 = *puVar21;
            lStack_2f8 = puVar17[3];
          }
          else {
            local_300 = *puVar21;
            local_310 = (ulong *)*puVar17;
          }
          local_308 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)puVar21 = 0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_2e0 = *puVar21;
            lStack_2d8 = puVar17[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar21;
            local_2f0 = (ulong *)*puVar17;
          }
          local_2e8 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          (anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                    (&local_288,(_anonymous_namespace_ *)(ulong)uVar27,(GLenum)local_2e8);
          uVar25 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar25 = local_2e0;
          }
          if (uVar25 < local_288._M_string_length + local_2e8) {
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              uVar26 = local_288.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_288._M_string_length + local_2e8) goto LAB_00399681;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_288,0,(char *)0x0,(ulong)local_2f0);
          }
          else {
LAB_00399681:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_2f0,(ulong)local_288._M_dataplus._M_p);
          }
          local_330 = &local_320;
          puVar21 = puVar17 + 2;
          if ((ulong *)*puVar17 == puVar21) {
            local_320 = *puVar21;
            lStack_318 = puVar17[3];
          }
          else {
            local_320 = *puVar21;
            local_330 = (ulong *)*puVar17;
          }
          local_328 = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)puVar21 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,local_2e0 + 1);
          }
          if (local_310 != &local_300) {
            operator_delete(local_310,local_300 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          lVar24 = 0;
          bVar19 = false;
          bVar20 = false;
          do {
            if (init::legalConversions[lVar24].inputType == primitive) {
              bVar20 = bVar19;
              if (init::legalConversions[lVar24].primitiveType == uVar27) {
                bVar19 = true;
                bVar20 = true;
              }
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0xb);
          if (!bVar20) {
            pTVar11 = (TestNode *)operator_new(0x90);
            pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar11,pCVar6->m_testCtx,
                       (char *)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start,(char *)local_330);
            pTVar11[1]._vptr_TestNode = (_func_int **)pCVar6;
            pTVar11->_vptr_TestNode = (_func_int **)&PTR__NegativeDrawCase_00b46a90;
            pTVar11[1].m_testCtx = (TestContext *)0x0;
            pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
            *(deUint32 *)&pTVar11[1].m_name._M_string_length = primitive;
            *(uint *)((long)&pTVar11[1].m_name._M_string_length + 4) = uVar27;
            tcu::TestNode::addChild(local_68,pTVar11);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330,local_320 + 1);
          }
          if ((pointer *)
              local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f0.pattern.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0xb);
        lVar24 = (long)local_218 + 1;
        if (lVar24 == 5) {
          pTVar12 = (TestNode *)operator_new(0xa8);
          pGVar9 = local_2d0;
          pCVar6 = (local_2d0->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_line_loop",
                     "Capture line loop lines");
          pTVar11 = local_40;
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_testCtx = (TestContext *)0x0;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          *(undefined8 *)((long)&pTVar12[1].m_name._M_dataplus._M_p + 4) = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name._M_string_length + 4) = 0;
          tcu::TestNode::addChild(local_40,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_line_strip",
                     "Capture line strip lines");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x100000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_triangle_strip",
                     "Capture triangle strip triangles");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x200000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_triangle_fan",
                     "Capture triangle fan triangles");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x300000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_draw_arrays",
                     "Capture primitives generated with drawArrays");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x400000000;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_draw_arrays_instanced",
                     "Capture primitives generated with drawArraysInstanced");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x400000001;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_draw_arrays_indirect",
                     "Capture primitives generated with drawArraysIndirect");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x400000002;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_draw_elements",
                     "Capture primitives generated with drawElements");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x400000003;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_draw_elements_instanced",
                     "Capture primitives generated with drawElementsInstanced");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x400000004;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0xa8);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,"capture_vertex_draw_elements_indirect",
                     "Capture primitives generated with drawElementsIndirect");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackCase_00b46ae0;
          pTVar12[1].m_testCtx = (TestContext *)0x400000005;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          *(undefined4 *)&pTVar12[1].m_name.field_2 = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name.field_2 + 8) = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0x98);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,
                     "capture_vertex_draw_arrays_overflow_single_buffer",
                     "Capture triangles to too small a buffer");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackOverflowCase_00b46b30;
          pTVar12[1].m_testCtx = (TestContext *)0x0;
          pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_name._M_string_length = 0;
          pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          pTVar12 = (TestNode *)operator_new(0x98);
          pCVar6 = (pGVar9->super_TestCaseGroup).m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar6->m_testCtx,
                     "capture_vertex_draw_elements_overflow_single_buffer",
                     "Capture triangles to too small a buffer");
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar6;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__VertexFeedbackOverflowCase_00b46b30;
          *(undefined4 *)&pTVar12[1].m_testCtx = 1;
          *(undefined8 *)((long)&pTVar12[1].m_testCtx + 4) = 0;
          *(undefined8 *)((long)&pTVar12[1].m_name._M_dataplus._M_p + 4) = 0;
          pTVar12[1].m_name._M_string_length = 0;
          pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          return extraout_EAX;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void GeometryShaderTests::init (void)
{
	struct PrimitiveTestSpec
	{
		deUint32	primitiveType;
		const char* name;
		deUint32	outputType;
	};

	struct EmitTestSpec
	{
		deUint32	outputType;
		int			emitCountA;		//!< primitive A emit count
		int			endCountA;		//!< primitive A end count
		int			emitCountB;		//!<
		int			endCountB;		//!<
		const char* name;
	};

	static const struct LayeredTarget
	{
		LayeredRenderCase::LayeredRenderTargetType	target;
		const char*									name;
		const char*									desc;
	} layerTargets[] =
	{
		{ LayeredRenderCase::TARGET_CUBE,			"cubemap",				"cubemap"						},
		{ LayeredRenderCase::TARGET_3D,				"3d",					"3D texture"					},
		{ LayeredRenderCase::TARGET_2D_ARRAY,		"2d_array",				"2D array texture"				},
		{ LayeredRenderCase::TARGET_2D_MS_ARRAY,	"2d_multisample_array",	"2D multisample array texture"	},
	};

	tcu::TestCaseGroup* const queryGroup				= new tcu::TestCaseGroup(m_testCtx, "query", "Query tests.");
	tcu::TestCaseGroup* const basicGroup				= new tcu::TestCaseGroup(m_testCtx, "basic", "Basic tests.");
	tcu::TestCaseGroup* const inputPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "input", "Different input primitives.");
	tcu::TestCaseGroup* const conversionPrimitiveGroup	= new tcu::TestCaseGroup(m_testCtx, "conversion", "Different input and output primitives.");
	tcu::TestCaseGroup* const emitGroup					= new tcu::TestCaseGroup(m_testCtx, "emit", "Different emit counts.");
	tcu::TestCaseGroup* const varyingGroup				= new tcu::TestCaseGroup(m_testCtx, "varying", "Test varyings.");
	tcu::TestCaseGroup* const layeredGroup				= new tcu::TestCaseGroup(m_testCtx, "layered", "Layered rendering.");
	tcu::TestCaseGroup* const instancedGroup			= new tcu::TestCaseGroup(m_testCtx, "instanced", "Instanced rendering.");
	tcu::TestCaseGroup* const negativeGroup				= new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests.");
	tcu::TestCaseGroup* const feedbackGroup				= new tcu::TestCaseGroup(m_testCtx, "vertex_transform_feedback", "Transform feedback.");

	this->addChild(queryGroup);
	this->addChild(basicGroup);
	this->addChild(inputPrimitiveGroup);
	this->addChild(conversionPrimitiveGroup);
	this->addChild(emitGroup);
	this->addChild(varyingGroup);
	this->addChild(layeredGroup);
	this->addChild(instancedGroup);
	this->addChild(negativeGroup);
	this->addChild(feedbackGroup);

	// query test
	{
		// limits with a corresponding glsl constant
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_input_components",				"", GL_MAX_GEOMETRY_INPUT_COMPONENTS,				"MaxGeometryInputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_components",				"", GL_MAX_GEOMETRY_OUTPUT_COMPONENTS,				"MaxGeometryOutputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_image_uniforms",					"", GL_MAX_GEOMETRY_IMAGE_UNIFORMS,					"MaxGeometryImageUniforms",			0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_texture_image_units",			"", GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,			"MaxGeometryTextureImageUnits",		16));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_vertices",				"", GL_MAX_GEOMETRY_OUTPUT_VERTICES,				"MaxGeometryOutputVertices",		256));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_total_output_components",		"", GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,		"MaxGeometryTotalOutputComponents",	1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_uniform_components",				"", GL_MAX_GEOMETRY_UNIFORM_COMPONENTS,				"MaxGeometryUniformComponents",		1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counters",				"", GL_MAX_GEOMETRY_ATOMIC_COUNTERS,				"MaxGeometryAtomicCounters",		0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counter_buffers",			"", GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,			"MaxGeometryAtomicCounterBuffers",	0));

		// program queries
		queryGroup->addChild(new GeometryShaderVerticesQueryCase	(m_context, "geometry_linked_vertices_out",	"GL_GEOMETRY_LINKED_VERTICES_OUT"));
		queryGroup->addChild(new GeometryShaderInputQueryCase		(m_context, "geometry_linked_input_type",	"GL_GEOMETRY_LINKED_INPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderOutputQueryCase		(m_context, "geometry_linked_output_type",	"GL_GEOMETRY_LINKED_OUTPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderInvocationsQueryCase	(m_context, "geometry_shader_invocations",	"GL_GEOMETRY_SHADER_INVOCATIONS"));

		// limits
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_invocations",		"", GL_MAX_GEOMETRY_SHADER_INVOCATIONS,		32));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_uniform_blocks",			"", GL_MAX_GEOMETRY_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_storage_blocks",	"", GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,	0));

		// layer_provoking_vertex_ext
		queryGroup->addChild(new LayerProvokingVertexQueryCase(m_context, "layer_provoking_vertex", "GL_LAYER_PROVOKING_VERTEX"));

		// primitives_generated
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_geometry",		"PRIMITIVES_GENERATED query with no geometry shader",								PrimitivesGeneratedQueryCase::TEST_NO_GEOMETRY));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_amplification",	"PRIMITIVES_GENERATED query with non amplifying geometry shader",					PrimitivesGeneratedQueryCase::TEST_NO_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_amplification",		"PRIMITIVES_GENERATED query with amplifying geometry shader",						PrimitivesGeneratedQueryCase::TEST_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_partial_primitives", "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives",		PrimitivesGeneratedQueryCase::TEST_PARTIAL_PRIMITIVES));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_instanced",			"PRIMITIVES_GENERATED query with instanced geometry shader",						PrimitivesGeneratedQueryCase::TEST_INSTANCED));

		queryGroup->addChild(new PrimitivesGeneratedQueryObjectQueryCase(m_context, "primitives_generated", "Query bound PRIMITIVES_GENERATED query"));

		// fbo
		queryGroup->addChild(new ImplementationLimitCase				(m_context, "max_framebuffer_layers",				"", GL_MAX_FRAMEBUFFER_LAYERS,	256));
		queryGroup->addChild(new FramebufferDefaultLayersCase			(m_context, "framebuffer_default_layers",			""));
		queryGroup->addChild(new FramebufferAttachmentLayeredCase		(m_context, "framebuffer_attachment_layered",		""));
		queryGroup->addChild(new FramebufferIncompleteLayereTargetsCase	(m_context, "framebuffer_incomplete_layer_targets",	""));

		// resource query
		queryGroup->addChild(new ReferencedByGeometryShaderCase			(m_context, "referenced_by_geometry_shader",	""));

		// combined limits
		queryGroup->addChild(new CombinedGeometryUniformLimitCase		(m_context, "max_combined_geometry_uniform_components", "MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS"));
	}

	// basic tests
	{
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10",				"Output 10 vertices",								OutputCountPatternSpec(10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128",				"Output 128 vertices",								OutputCountPatternSpec(128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_256",				"Output 256 vertices",								OutputCountPatternSpec(256)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_max",				"Output max vertices",								OutputCountPatternSpec(-1)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10_and_100",		"Output 10 and 100 vertices in two invocations",	OutputCountPatternSpec(10, 100)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_100_and_10",		"Output 100 and 10 vertices in two invocations",	OutputCountPatternSpec(100, 10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_0_and_128",			"Output 0 and 128 vertices in two invocations",		OutputCountPatternSpec(0, 128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128_and_0",			"Output 128 and 0 vertices in two invocations",		OutputCountPatternSpec(128, 0)));

		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_attribute",	"Output varying number of vertices",				VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_uniform",	"Output varying number of vertices",				VaryingOutputCountShader::READ_UNIFORM,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_texture",	"Output varying number of vertices",				VaryingOutputCountShader::READ_TEXTURE,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));

		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"point_size",				"test gl_PointSize",								BuiltinVariableShader::TEST_POINT_SIZE));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in",			"test gl_PrimitiveIDIn",							BuiltinVariableShader::TEST_PRIMITIVE_ID_IN));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in_restarted","test gl_PrimitiveIDIn with primitive restart",		BuiltinVariableShader::TEST_PRIMITIVE_ID_IN, GeometryShaderRenderTest::FLAG_USE_RESTART_INDEX | GeometryShaderRenderTest::FLAG_USE_INDICES));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id",				"test gl_PrimitiveID",								BuiltinVariableShader::TEST_PRIMITIVE_ID));
	}

	// input primitives
	{
		static const PrimitiveTestSpec inputPrimitives[] =
		{
			{ GL_POINTS,					"points",					GL_POINTS			},
			{ GL_LINES,						"lines",					GL_LINE_STRIP		},
			{ GL_LINE_LOOP,					"line_loop",				GL_LINE_STRIP		},
			{ GL_LINE_STRIP,				"line_strip",				GL_LINE_STRIP		},
			{ GL_TRIANGLES,					"triangles",				GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_STRIP,			"triangle_strip",			GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_FAN,				"triangle_fan",				GL_TRIANGLE_STRIP	},
			{ GL_LINES_ADJACENCY,			"lines_adjacency",			GL_LINE_STRIP		},
			{ GL_LINE_STRIP_ADJACENCY,		"line_strip_adjacency",		GL_LINE_STRIP		},
			{ GL_TRIANGLES_ADJACENCY,		"triangles_adjacency",		GL_TRIANGLE_STRIP	}
		};

		tcu::TestCaseGroup* const basicPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "basic_primitive",			"Different input and output primitives.");
		tcu::TestCaseGroup* const triStripAdjacencyGroup	= new tcu::TestCaseGroup(m_testCtx, "triangle_strip_adjacency",	"Different triangle_strip_adjacency vertex counts.");

		// more basic types
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(inputPrimitives); ++ndx)
			basicPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, inputPrimitives[ndx].name, inputPrimitives[ndx].name, inputPrimitives[ndx].primitiveType, inputPrimitives[ndx].outputType));

		// triangle strip adjacency with different vtx counts
		for (int vtxCount = 0; vtxCount <= 12; ++vtxCount)
		{
			const std::string name = "vertex_count_" + de::toString(vtxCount);
			const std::string desc = "Vertex count is " + de::toString(vtxCount);

			triStripAdjacencyGroup->addChild(new TriangleStripAdjacencyVertexCountTest(m_context, name.c_str(), desc.c_str(), vtxCount));
		}

		inputPrimitiveGroup->addChild(basicPrimitiveGroup);
		inputPrimitiveGroup->addChild(triStripAdjacencyGroup);
	}

	// different type conversions
	{
		static const PrimitiveTestSpec conversionPrimitives[] =
		{
			{ GL_TRIANGLES,		"triangles_to_points",	GL_POINTS			},
			{ GL_LINES,			"lines_to_points",		GL_POINTS			},
			{ GL_POINTS,		"points_to_lines",		GL_LINE_STRIP		},
			{ GL_TRIANGLES,		"triangles_to_lines",	GL_LINE_STRIP		},
			{ GL_POINTS,		"points_to_triangles",	GL_TRIANGLE_STRIP	},
			{ GL_LINES,			"lines_to_triangles",	GL_TRIANGLE_STRIP	}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(conversionPrimitives); ++ndx)
			conversionPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, conversionPrimitives[ndx].name, conversionPrimitives[ndx].name, conversionPrimitives[ndx].primitiveType, conversionPrimitives[ndx].outputType));
	}

	// emit different amounts
	{
		static const EmitTestSpec emitTests[] =
		{
			{ GL_POINTS,			 0,		0,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		2,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		2,	0,	0,	"points"			},
			{ GL_LINE_STRIP,		 0,		0,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	2,	0,	"line_strip"		},
			{ GL_TRIANGLE_STRIP,	 0,		0,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	3,	0,	"triangle_strip"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			std::string name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			std::string desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(m_context, name.c_str(), desc.c_str(), emitTests[ndx].emitCountA, emitTests[ndx].endCountA, emitTests[ndx].emitCountB, emitTests[ndx].endCountB, emitTests[ndx].outputType));
		}
	}

	// varying
	{
		struct VaryingTestSpec
		{
			int			vertexOutputs;
			int			geometryOutputs;
			const char*	name;
			const char*	desc;
		};

		static const VaryingTestSpec varyingTests[] =
		{
			{ -1, 1, "vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{  0, 1, "vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{  0, 2, "vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{  1, 0, "vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{  1, 2, "vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(m_context, varyingTests[ndx].name, varyingTests[ndx].desc, varyingTests[ndx].vertexOutputs, varyingTests[ndx].geometryOutputs));
	}

	// layered
	{
		static const struct TestType
		{
			LayeredRenderCase::TestType	test;
			const char*					testPrefix;
			const char*					descPrefix;
		} tests[] =
		{
			{ LayeredRenderCase::TEST_DEFAULT_LAYER,			"render_with_default_layer_",	"Render to all layers of "					},
			{ LayeredRenderCase::TEST_SINGLE_LAYER,				"render_to_one_",				"Render to one layer of "					},
			{ LayeredRenderCase::TEST_ALL_LAYERS,				"render_to_all_",				"Render to all layers of "					},
			{ LayeredRenderCase::TEST_DIFFERENT_LAYERS,			"render_different_to_",			"Render different data to different layers"	},
			{ LayeredRenderCase::TEST_LAYER_ID,					"fragment_layer_",				"Read gl_Layer in fragment shader"			},
			{ LayeredRenderCase::TEST_LAYER_PROVOKING_VERTEX,	"layer_provoking_vertex_",		"Verify LAYER_PROVOKING_VERTEX"				},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string(tests[testNdx].testPrefix) + layerTargets[targetNdx].name;
			const std::string desc = std::string(tests[testNdx].descPrefix) + layerTargets[targetNdx].desc;

			layeredGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, tests[testNdx].test));
		}
	}

	// instanced
	{
		static const struct InvocationCase
		{
			const char* name;
			int			numInvocations;
		} invocationCases[] =
		{
			{ "1",		1  },
			{ "2",		2  },
			{ "8",		8  },
			{ "32",		32 },
			{ "max",	-1 },
		};
		static const int numDrawInstances[] = { 2, 4, 8 };
		static const int numDrawInvocations[] = { 2, 8 };

		// same amount of content to all invocations
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			instancedGroup->addChild(new GeometryInvocationCase(m_context,
																(std::string("geometry_") + invocationCases[ndx].name + "_invocations").c_str(),
																(std::string("Geometry shader with ") + invocationCases[ndx].name + " invocation(s)").c_str(),
																invocationCases[ndx].numInvocations,
																GeometryInvocationCase::CASE_FIXED_OUTPUT_COUNTS));

		// different amount of content to each invocation
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			if (invocationCases[ndx].numInvocations != 1)
				instancedGroup->addChild(new GeometryInvocationCase(m_context,
																	(std::string("geometry_output_different_") + invocationCases[ndx].name + "_invocations").c_str(),
																	"Geometry shader invocation(s) with different emit counts",
																	invocationCases[ndx].numInvocations,
																	GeometryInvocationCase::CASE_DIFFERENT_OUTPUT_COUNTS));

		// invocation per layer
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("invocation_per_layer_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, one invocation per layer, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_INVOCATION_PER_LAYER));
		}

		// multiple layers per invocation
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("multiple_layers_per_invocation_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, multiple layers per invocation, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_MULTIPLE_LAYERS_PER_INVOCATION));
		}

		// different invocation output counts depending on {uniform, attrib, texture}
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_attribute",	"Output varying number of vertices", VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_uniform",	"Output varying number of vertices", VaryingOutputCountShader::READ_UNIFORM,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_texture",	"Output varying number of vertices", VaryingOutputCountShader::READ_TEXTURE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));

		// with drawInstanced
		for (int instanceNdx = 0; instanceNdx < DE_LENGTH_OF_ARRAY(numDrawInstances); ++instanceNdx)
		for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(numDrawInvocations); ++invocationNdx)
		{
			const std::string name = std::string("draw_") + de::toString(numDrawInstances[instanceNdx]) + "_instances_geometry_" + de::toString(numDrawInvocations[invocationNdx]) + "_invocations";
			const std::string desc = std::string("Draw ") + de::toString(numDrawInstances[instanceNdx]) + " instances, with " + de::toString(numDrawInvocations[invocationNdx]) + " geometry shader invocations.";

			instancedGroup->addChild(new DrawInstancedGeometryInstancedCase(m_context, name.c_str(), desc.c_str(), numDrawInstances[instanceNdx], numDrawInvocations[invocationNdx]));
		}
	}

	// negative (wrong types)
	{
		struct PrimitiveToInputTypeConversion
		{
			GLenum inputType;
			GLenum primitiveType;
		};

		static const PrimitiveToInputTypeConversion legalConversions[] =
		{
			{ GL_POINTS,				GL_POINTS					},
			{ GL_LINES,					GL_LINES					},
			{ GL_LINES,					GL_LINE_LOOP				},
			{ GL_LINES,					GL_LINE_STRIP				},
			{ GL_LINES_ADJACENCY,		GL_LINES_ADJACENCY			},
			{ GL_LINES_ADJACENCY,		GL_LINE_STRIP_ADJACENCY		},
			{ GL_TRIANGLES,				GL_TRIANGLES				},
			{ GL_TRIANGLES,				GL_TRIANGLE_STRIP			},
			{ GL_TRIANGLES,				GL_TRIANGLE_FAN				},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLES_ADJACENCY		},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLE_STRIP_ADJACENCY	},
		};

		static const GLenum inputTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINES_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLES_ADJACENCY
		};

		static const GLenum primitiveTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINE_LOOP,
			GL_LINE_STRIP,
			GL_LINES_ADJACENCY,
			GL_LINE_STRIP_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLE_STRIP,
			GL_TRIANGLE_FAN,
			GL_TRIANGLES_ADJACENCY,
			GL_TRIANGLE_STRIP_ADJACENCY
		};

		for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); ++inputTypeNdx)
		for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
		{
			const GLenum		inputType		= inputTypes[inputTypeNdx];
			const GLenum		primitiveType	= primitiveTypes[primitiveTypeNdx];
			const std::string	name			= std::string("type_") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + "_primitive_" + primitiveTypeToString(primitiveType);
			const std::string	desc			= std::string("Shader input type ") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + ", draw primitive type " + primitiveTypeToString(primitiveType);

			bool isLegal = false;

			for (int legalNdx = 0; legalNdx < DE_LENGTH_OF_ARRAY(legalConversions); ++legalNdx)
				if (legalConversions[legalNdx].inputType == inputType && legalConversions[legalNdx].primitiveType == primitiveType)
					isLegal = true;

			// only illegal
			if (!isLegal)
				negativeGroup->addChild(new NegativeDrawCase(m_context, name.c_str(), desc.c_str(), inputType, primitiveType));
		}
	}

	// vertex transform feedback
	{
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_loop",				"Capture line loop lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_LOOP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_strip",				"Capture line strip lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_strip",			"Capture triangle strip triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_fan",			"Capture triangle fan triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_FAN));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays",				"Capture primitives generated with drawArrays",				VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_instanced",	"Capture primitives generated with drawArraysInstanced",	VertexFeedbackCase::METHOD_DRAW_ARRAYS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_indirect",	"Capture primitives generated with drawArraysIndirect",		VertexFeedbackCase::METHOD_DRAW_ARRAYS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements",			"Capture primitives generated with drawElements",			VertexFeedbackCase::METHOD_DRAW_ELEMENTS,			VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_instanced",	"Capture primitives generated with drawElementsInstanced",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_indirect",	"Capture primitives generated with drawElementsIndirect",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));

		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_arrays_overflow_single_buffer",		"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ARRAYS));
		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_elements_overflow_single_buffer",	"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ELEMENTS));
	}
}